

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.cpp
# Opt level: O2

void __thiscall dg::sdg::DGArgumentPair::DGArgumentPair(DGArgumentPair *this,DGParameters *p)

{
  int iVar1;
  DependenceGraph *pDVar2;
  
  pDVar2 = p->_dg;
  iVar1 = *(int *)(pDVar2 + 4);
  *(uint *)(pDVar2 + 4) = iVar1 + 1U;
  (this->super_DGElement)._id = iVar1 + 1U;
  (this->super_DGElement)._type = ARG_PAIR;
  (this->super_DGElement)._dg = pDVar2;
  (this->super_DGElement)._vptr_DGElement = (_func_int **)&PTR__DGArgumentPair_00105cc0;
  this->_parameters = p;
  DGNodeArgument::DGNodeArgument(&this->_input,p->_dg);
  DGNodeArgument::DGNodeArgument(&this->_output,p->_dg);
  return;
}

Assistant:

DGArgumentPair::DGArgumentPair(DGParameters &p)
        : DGElement(p.getDG(), DGElementType::ARG_PAIR), _parameters(p),
          _input(p.getDG()), _output(p.getDG()) {}